

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O1

void __thiscall
QPDF::updateObjectMaps
          (QPDF *this,ObjUser *first_ou,QPDFObjectHandle *first_oh,
          function<int_(QPDFObjectHandle_&)> *skip_stream_parameters)

{
  pointer pUVar1;
  _Rb_tree_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  *__v;
  ObjUser *pOVar3;
  size_type this_01;
  key_type *pkVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  __index_type _Var8;
  int iVar9;
  pointer __p;
  _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
  *this_02;
  _Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
  *this_03;
  iterator __args_1;
  iterator iVar10;
  QPDF_Dictionary *pQVar11;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar12;
  ObjUser *pOVar13;
  _Rb_tree_node_base *p_Var14;
  QPDFObjectHandle *item;
  _Rb_tree_node_base *p_Var15;
  unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_> thumb_ou;
  QPDFObjGen og;
  value_type cur;
  vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_> pending;
  set visited;
  bool local_109;
  ObjUser *local_108;
  int local_fc;
  string local_f8;
  key_type *local_d8;
  QPDFObjectHandle local_d0;
  char local_c0;
  string local_b8;
  QPDFObjectHandle local_98;
  vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_> local_88;
  _Any_data *local_70;
  QPDF *local_68;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88.
  super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8 = (key_type *)CONCAT71(local_d8._1_7_,1);
  local_70 = (_Any_data *)skip_stream_parameters;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>::
  emplace_back<QPDF::ObjUser_const&,QPDFObjectHandle&,bool>
            ((vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>> *)
             &local_88,first_ou,first_oh,(bool *)&local_d8);
  local_108 = (ObjUser *)0x0;
  if (local_88.
      super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_68 = this;
    do {
      local_d8 = local_88.
                 super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].ou;
      local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_88.
               super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].oh.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_88.
           super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].oh.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_d0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_d0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      local_c0 = local_88.
                 super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].top;
      pUVar1 = local_88.
               super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      this_00 = local_88.
                super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].oh.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_88.
      super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>.
      _M_impl.super__Vector_impl_data._M_finish = pUVar1;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"/Page","");
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
      bVar6 = QPDFObjectHandle::isDictionaryOfType(&local_d0,&local_f8,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((!bVar6) || (local_c0 != '\0')) {
        bVar7 = QPDFObjectHandle::isIndirect(&local_d0);
        if (bVar7) {
          local_f8._M_dataplus._M_p = (pointer)QPDFObjectHandle::getObjGen(&local_d0);
          bVar7 = QPDFObjGen::set::add((set *)&local_60,(QPDFObjGen)local_f8._M_dataplus._M_p);
          if (bVar7) {
            this_02 = (_Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
                       *)std::
                         map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                         ::operator[](&((this->m)._M_t.
                                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                       ->obj_user_to_objects,local_d8);
            std::
            _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
            ::_M_insert_unique<QPDFObjGen_const&>(this_02,(QPDFObjGen *)&local_f8);
            this_03 = (_Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
                       *)std::
                         map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
                         ::operator[](&((this->m)._M_t.
                                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                       ->object_to_obj_users,(key_type *)&local_f8);
            std::
            _Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
            ::_M_insert_unique<QPDF::ObjUser_const&>(this_03,local_d8);
            if (bVar7) goto LAB_00238c8e;
          }
        }
        else {
LAB_00238c8e:
          bVar7 = QPDFObjectHandle::isArray(&local_d0);
          if (bVar7) {
            local_f8._M_dataplus._M_p =
                 (pointer)local_d0.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_f8._M_string_length =
                 (size_type)
                 local_d0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (local_d0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_d0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_d0.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_d0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_d0.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_f8.field_2._M_allocated_capacity = 0;
            __args_1 = ::qpdf::Array::begin((Array *)&local_f8);
            iVar10 = ::qpdf::Array::end((Array *)&local_f8);
            for (; __args_1._M_current != iVar10._M_current;
                __args_1._M_current = __args_1._M_current + 1) {
              local_b8._M_dataplus._M_p = local_b8._M_dataplus._M_p & 0xffffffffffffff00;
              std::vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>::
              emplace_back<QPDF::ObjUser_const&,QPDFObjectHandle_const&,bool>
                        ((vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>
                          *)&local_88,local_d8,__args_1._M_current,(bool *)&local_b8);
            }
            std::
            unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
            ::~unique_ptr((unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                           *)&local_f8.field_2._M_allocated_capacity);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
            }
          }
          else {
            bVar7 = QPDFObjectHandle::isDictionary(&local_d0);
            if ((bVar7) || (bVar7 = QPDFObjectHandle::isStream(&local_d0), bVar7)) {
              local_f8._M_dataplus._M_p =
                   (pointer)local_d0.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_f8._M_string_length =
                   (size_type)
                   local_d0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              if (local_d0.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_d0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_d0.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_d0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_d0.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              bVar7 = QPDFObjectHandle::isStream(&local_d0);
              local_fc = 0;
              if (bVar7) {
                QPDFObjectHandle::getDict((QPDFObjectHandle *)&local_b8);
                sVar5 = local_b8._M_string_length;
                local_f8._M_dataplus._M_p = local_b8._M_dataplus._M_p;
                this_01 = local_f8._M_string_length;
                local_b8._M_dataplus._M_p = (pointer)0x0;
                local_b8._M_string_length = 0;
                local_f8._M_string_length = sVar5;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_b8._M_string_length);
                }
                if (*(long *)(local_70 + 1) != 0) {
                  local_fc = (**(code **)(local_70->_M_pod_data + 0x18))(local_70,&local_d0);
                }
              }
              local_b8._M_dataplus._M_p = local_f8._M_dataplus._M_p;
              local_b8._M_string_length = local_f8._M_string_length;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)(local_f8._M_string_length + 8) =
                       *(_Atomic_word *)(local_f8._M_string_length + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)(local_f8._M_string_length + 8) =
                       *(_Atomic_word *)(local_f8._M_string_length + 8) + 1;
                }
              }
              pQVar11 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)&local_b8);
              if (pQVar11 == (QPDF_Dictionary *)0x0) {
                p_Var14 = (_Rb_tree_node_base *)0x0;
              }
              else {
                p_Var14 = (pQVar11->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              pQVar11 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)&local_b8);
              p_Var15 = &(pQVar11->items)._M_t._M_impl.super__Rb_tree_header._M_header;
              if (pQVar11 == (QPDF_Dictionary *)0x0) {
                p_Var15 = (_Rb_tree_node_base *)0x0;
              }
              for (; p_Var14 != p_Var15;
                  p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
                __v = *(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        **)(p_Var14 + 2);
                if (__v != (variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                            *)0x0) {
                  _Var8 = (__v->
                          super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          ).
                          super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          .
                          super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          .
                          super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          .
                          super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          .
                          super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          ._M_index;
                  if (_Var8 == '\x0f') {
                    pvVar12 = std::
                              get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                                        (__v);
LAB_00238e96:
                    _Var8 = *(__index_type *)
                             ((long)&(((pvVar12->obj).
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->value).
                                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             + 0x30);
                  }
                  else if (_Var8 == '\r') {
                    pvVar12 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                               *)resolve(*(QPDF **)((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x10),
                                         *(QPDFObjGen *)
                                          ((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x18));
                    goto LAB_00238e96;
                  }
                  if (_Var8 != '\x02') {
                    p_Var2 = p_Var14 + 1;
                    if (bVar6) {
                      iVar9 = std::__cxx11::string::compare((char *)p_Var2);
                      pkVar4 = local_d8;
                      if (iVar9 == 0) {
                        pOVar13 = (ObjUser *)operator_new(0x28);
                        pOVar3 = local_108;
                        iVar9 = pkVar4->pageno;
                        pOVar13->ou_type = ou_thumb;
                        pOVar13->pageno = iVar9;
                        (pOVar13->key)._M_dataplus._M_p = (pointer)&(pOVar13->key).field_2;
                        (pOVar13->key)._M_string_length = 0;
                        (pOVar13->key).field_2._M_local_buf[0] = '\0';
                        local_98.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)0x0;
                        bVar7 = local_108 != (ObjUser *)0x0;
                        local_108 = pOVar13;
                        if (bVar7) {
                          std::default_delete<QPDF::ObjUser>::operator()
                                    ((default_delete<QPDF::ObjUser> *)&local_108,pOVar3);
                        }
                        if (local_98.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                            (element_type *)0x0) {
                          std::default_delete<QPDF::ObjUser>::operator()
                                    ((default_delete<QPDF::ObjUser> *)&local_98,
                                     (ObjUser *)
                                     local_98.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr);
                        }
                        pOVar3 = local_108;
                        QPDFObjectHandle::getKey(&local_98,&local_f8);
                        local_109 = false;
                        std::
                        vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>
                        ::emplace_back<QPDF::ObjUser&,QPDFObjectHandle,bool>
                                  ((vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>
                                    *)&local_88,pOVar3,&local_98,&local_109);
                        if (local_98.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (local_98.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi);
                        }
                      }
                      else if ((!bVar6) ||
                              (iVar9 = std::__cxx11::string::compare((char *)p_Var2), iVar9 != 0))
                      goto LAB_00238ee1;
                    }
                    else {
LAB_00238ee1:
                      if (((local_fc < 1) ||
                          (iVar9 = std::__cxx11::string::compare((char *)p_Var2), iVar9 != 0)) &&
                         ((local_fc < 2 ||
                          ((iVar9 = std::__cxx11::string::compare((char *)p_Var2), iVar9 != 0 &&
                           (iVar9 = std::__cxx11::string::compare((char *)p_Var2), iVar9 != 0))))))
                      {
                        local_98.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)
                             ((ulong)local_98.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr & 0xffffffffffffff00);
                        std::
                        vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>
                        ::emplace_back<QPDF::ObjUser_const&,QPDFObjectHandle&,bool>
                                  ((vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>
                                    *)&local_88,local_d8,(QPDFObjectHandle *)(p_Var14 + 2),
                                   (bool *)&local_98);
                      }
                    }
                  }
                }
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length
                          );
              }
              this = local_68;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length
                          );
              }
            }
          }
        }
      }
      if (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    } while (local_88.
             super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_88.
             super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_108 != (ObjUser *)0x0) {
    std::default_delete<QPDF::ObjUser>::operator()
              ((default_delete<QPDF::ObjUser> *)&local_108,local_108);
  }
  std::vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>::~vector
            (&local_88);
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void
QPDF::updateObjectMaps(
    ObjUser const& first_ou,
    QPDFObjectHandle first_oh,
    std::function<int(QPDFObjectHandle&)> skip_stream_parameters)
{
    QPDFObjGen::set visited;
    std::vector<UpdateObjectMapsFrame> pending;
    pending.emplace_back(first_ou, first_oh, true);
    // Traverse the object tree from this point taking care to avoid crossing page boundaries.
    std::unique_ptr<ObjUser> thumb_ou;
    while (!pending.empty()) {
        auto cur = pending.back();
        pending.pop_back();

        bool is_page_node = false;

        if (cur.oh.isDictionaryOfType("/Page")) {
            is_page_node = true;
            if (!cur.top) {
                continue;
            }
        }

        if (cur.oh.isIndirect()) {
            QPDFObjGen og(cur.oh.getObjGen());
            if (!visited.add(og)) {
                QTC::TC("qpdf", "QPDF opt loop detected");
                continue;
            }
            m->obj_user_to_objects[cur.ou].insert(og);
            m->object_to_obj_users[og].insert(cur.ou);
        }

        if (cur.oh.isArray()) {
            for (auto const& item: cur.oh.as_array()) {
                pending.emplace_back(cur.ou, item, false);
            }
        } else if (cur.oh.isDictionary() || cur.oh.isStream()) {
            QPDFObjectHandle dict = cur.oh;
            bool is_stream = cur.oh.isStream();
            int ssp = 0;
            if (is_stream) {
                dict = cur.oh.getDict();
                if (skip_stream_parameters) {
                    ssp = skip_stream_parameters(cur.oh);
                }
            }

            for (auto& [key, value]: dict.as_dictionary()) {
                if (value.null()) {
                    continue;
                }

                if (is_page_node && (key == "/Thumb")) {
                    // Traverse page thumbnail dictionaries as a special case. There can only ever
                    // be one /Thumb key on a page, and we see at most one page node per call.
                    thumb_ou = std::make_unique<ObjUser>(ObjUser::ou_thumb, cur.ou.pageno);
                    pending.emplace_back(*thumb_ou, dict.getKey(key), false);
                } else if (is_page_node && (key == "/Parent")) {
                    // Don't traverse back up the page tree
                } else if (
                    ((ssp >= 1) && (key == "/Length")) ||
                    ((ssp >= 2) && ((key == "/Filter") || (key == "/DecodeParms")))) {
                    // Don't traverse into stream parameters that we are not going to write.
                } else {
                    pending.emplace_back(cur.ou, value, false);
                }
            }
        }
    }
}